

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ConfigParseRank(char *zIn,char **pzRank,char **pzRankArgs)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  char *p;
  char *pcVar4;
  char *pIn;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  byte *__src;
  char *__src_00;
  size_t sVar10;
  size_t __n;
  int rc;
  int local_44;
  char **local_40;
  char **local_38;
  
  local_44 = 0;
  pcVar4 = (char *)0x0;
  *pzRank = (char *)0x0;
  *pzRankArgs = (char *)0x0;
  iVar8 = 1;
  iVar9 = iVar8;
  if (zIn != (char *)0x0) {
    pcVar4 = zIn + -1;
    pbVar1 = (byte *)zIn;
    do {
      __src = pbVar1;
      __src_00 = pcVar4;
      bVar3 = *__src;
      zIn = zIn + 1;
      pcVar4 = __src_00 + 1;
      pbVar1 = __src + 1;
    } while (bVar3 == 0x20);
    uVar6 = 0;
    while (((char)bVar3 < '\0' || ((&DAT_001e2c10)[bVar3] != '\0'))) {
      pbVar1 = (byte *)(__src_00 + 2);
      __src_00 = __src_00 + 1;
      uVar6 = uVar6 - 1;
      bVar3 = *pbVar1;
    }
    local_38 = pzRank;
    if (uVar6 == 0) {
      pcVar4 = (char *)0x0;
    }
    else {
      local_40 = pzRankArgs;
      pcVar4 = (char *)sqlite3Fts5MallocZero(&local_44,1 - uVar6);
      if (pcVar4 != (char *)0x0) {
        memcpy(pcVar4,__src,-uVar6);
      }
      iVar9 = local_44;
      if (local_44 == 0) {
        pcVar7 = zIn + ~uVar6;
        do {
          pcVar5 = __src_00 + 1;
          __src_00 = __src_00 + 1;
          pcVar7 = pcVar7 + 1;
        } while (*pcVar5 == ' ');
        iVar9 = iVar8;
        if (*pcVar5 == '(') {
          do {
            pcVar5 = __src_00 + 1;
            __src_00 = __src_00 + 1;
            pcVar7 = pcVar7 + 1;
          } while (*pcVar5 == ' ');
          if (*pcVar5 == ')') {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar5 = __src_00;
            do {
              do {
                pIn = pcVar5;
                pcVar5 = pIn + 1;
              } while (*pIn == ' ');
              pcVar5 = fts5ConfigSkipLiteral(pIn);
              if (pcVar5 == (char *)0x0) goto LAB_001c8e39;
              __n = (long)pcVar5 - (long)pcVar7;
              do {
                sVar10 = __n;
                cVar2 = *pcVar5;
                pcVar5 = pcVar5 + 1;
                __n = sVar10 + 1;
              } while (cVar2 == ' ');
            } while (cVar2 == ',');
            if (cVar2 != ')') goto LAB_001c8e39;
            pcVar7 = (char *)sqlite3Fts5MallocZero(&local_44,sVar10 + 2);
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)0x0;
            }
            else {
              memcpy(pcVar7,__src_00,__n);
            }
          }
          iVar9 = local_44;
          if (local_44 == 0) {
            *local_38 = pcVar4;
            *local_40 = pcVar7;
            return 0;
          }
        }
      }
    }
  }
LAB_001c8e39:
  sqlite3_free(pcVar4);
  return iVar9;
}

Assistant:

static int sqlite3Fts5ConfigParseRank(
  const char *zIn,                /* Input string */
  char **pzRank,                  /* OUT: Rank function name */
  char **pzRankArgs               /* OUT: Rank function arguments */
){
  const char *p = zIn;
  const char *pRank;
  char *zRank = 0;
  char *zRankArgs = 0;
  int rc = SQLITE_OK;

  *pzRank = 0;
  *pzRankArgs = 0;

  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    p = fts5ConfigSkipWhitespace(p);
    pRank = p;
    p = fts5ConfigSkipBareword(p);

    if( p ){
      zRank = sqlite3Fts5MallocZero(&rc, 1 + p - pRank);
      if( zRank ) memcpy(zRank, pRank, p-pRank);
    }else{
      rc = SQLITE_ERROR;
    }

    if( rc==SQLITE_OK ){
      p = fts5ConfigSkipWhitespace(p);
      if( *p!='(' ) rc = SQLITE_ERROR;
      p++;
    }
    if( rc==SQLITE_OK ){
      const char *pArgs; 
      p = fts5ConfigSkipWhitespace(p);
      pArgs = p;
      if( *p!=')' ){
        p = fts5ConfigSkipArgs(p);
        if( p==0 ){
          rc = SQLITE_ERROR;
        }else{
          zRankArgs = sqlite3Fts5MallocZero(&rc, 1 + p - pArgs);
          if( zRankArgs ) memcpy(zRankArgs, pArgs, p-pArgs);
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRank);
    assert( zRankArgs==0 );
  }else{
    *pzRank = zRank;
    *pzRankArgs = zRankArgs;
  }
  return rc;
}